

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImGuiContext *pIVar1;
  undefined1 in_SIL;
  long in_RDI;
  bool init_for_nav;
  ImGuiContext *g;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffd4;
  ImGuiID in_stack_ffffffffffffffdc;
  ImGuiNavLayer in_stack_ffffffffffffffe0;
  uint3 in_stack_ffffffffffffffe4;
  ImGuiID id;
  undefined3 in_stack_fffffffffffffff4;
  ImGuiID focus_scope_id;
  
  pIVar1 = GImGui;
  focus_scope_id = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  if ((*(uint *)(in_RDI + 0x14) & 0x10000) == 0) {
    id = (ImGuiID)in_stack_ffffffffffffffe4;
    if ((((in_RDI == *(long *)(in_RDI + 0x390)) || ((*(uint *)(in_RDI + 0x14) & 0x4000000) != 0)) ||
        (*(int *)(in_RDI + 0x3c0) == 0)) || ((char)(focus_scope_id >> 0x18) != '\0')) {
      id = CONCAT13(1,in_stack_ffffffffffffffe4);
    }
    if ((GImGui->DebugLogFlags & 8U) != 0) {
      DebugLog("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n"
               ,(ulong)(byte)(id >> 0x18),*(undefined8 *)(in_RDI + 8),(ulong)GImGui->NavLayer);
    }
    if ((id & 0x1000000) == 0) {
      pIVar1->NavId = *(ImGuiID *)(in_RDI + 0x3c0);
      SetNavFocusScope(focus_scope_id);
    }
    else {
      uVar2 = *(undefined4 *)(in_RDI + 0x3f8);
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffffd4,uVar2));
      SetNavID(id,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
               (ImRect *)CONCAT44(in_stack_ffffffffffffffd4,uVar2));
      pIVar1->NavInitRequest = true;
      pIVar1->NavInitRequestFromMove = false;
      (pIVar1->NavInitResult).ID = 0;
      NavUpdateAnyRequestFlag();
    }
  }
  else {
    GImGui->NavId = 0;
    SetNavFocusScope(focus_scope_id);
  }
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);

    if (window->Flags & ImGuiWindowFlags_NoNavInputs)
    {
        g.NavId = 0;
        SetNavFocusScope(window->NavRootFocusScopeId);
        return;
    }

    bool init_for_nav = false;
    if (window == window->RootWindow || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
        init_for_nav = true;
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n", init_for_nav, window->Name, g.NavLayer);
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer, window->NavRootFocusScopeId, ImRect());
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResult.ID = 0;
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
        SetNavFocusScope(window->NavRootFocusScopeId);
    }
}